

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.hpp
# Opt level: O2

bool __thiscall
myvk::RenderPassState::SubpassDependencyKey::operator<
          (SubpassDependencyKey *this,SubpassDependencyKey *r)

{
  strong_ordering sVar1;
  VkDependencyFlags *local_30;
  uint32_t *local_28;
  SubpassDependencyKey *local_20;
  VkDependencyFlags *local_18;
  uint32_t *local_10;
  SubpassDependencyKey *local_8;
  
  local_10 = &this->subpass_to;
  local_18 = &this->dependency_flag;
  local_28 = &r->subpass_to;
  local_30 = &r->dependency_flag;
  local_20 = r;
  local_8 = this;
  sVar1 = std::
          __tuple_cmp<std::strong_ordering,std::tuple<unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>,std::tuple<unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>,0ul,1ul,2ul>
                    (&local_18,&local_30);
  return (bool)((byte)sVar1._M_value >> 7);
}

Assistant:

inline bool operator<(const SubpassDependencyKey &r) const {
			return std::tie(subpass_from, subpass_to, dependency_flag) <
			       std::tie(r.subpass_from, r.subpass_to, r.dependency_flag);
		}